

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTIN.cpp
# Opt level: O0

string * ZXing::GTIN::Price(string *ean5AddOn)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  _Setprecision _Var5;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong in_RSI;
  string *in_RDI;
  stringstream buf;
  int rawAmount;
  string currency;
  size_t *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  allocator<char> *in_stack_fffffffffffffde0;
  allocator<char> *__a;
  undefined6 in_stack_fffffffffffffde8;
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  string local_68 [32];
  int local_48;
  allocator<char> local_42;
  allocator<char> local_41;
  undefined4 local_40;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 5) {
    std::__cxx11::string::string((string *)in_RDI);
    return in_RDI;
  }
  std::__cxx11::string::string(local_30);
  pcVar7 = (char *)std::__cxx11::string::front();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)((int)*pcVar7 - 0x30);
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::__cxx11::string::operator=(local_30,anon_var_dwarf_3b7eb);
    break;
  default:
    std::__cxx11::string::operator=(local_30,"");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::__cxx11::string::operator=(local_30,"AUD $");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::__cxx11::string::operator=(local_30,"NZD $");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::__cxx11::string::operator=(local_30,"USD $");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    std::__cxx11::string::operator=(local_30,"CAD $");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                            (char *)in_stack_fffffffffffffda8);
    if ((bool)uVar1) {
      std::__cxx11::string::string((string *)in_RDI);
      local_40 = 1;
      goto LAB_0022b188;
    }
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                            (char *)in_stack_fffffffffffffda8);
    if ((bool)uVar2) {
      __a = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffde8)),__a);
      std::allocator<char>::~allocator(&local_41);
      local_40 = 1;
      goto LAB_0022b188;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                            (char *)in_stack_fffffffffffffda8);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffde8)),
                 in_stack_fffffffffffffde0);
      std::allocator<char>::~allocator(&local_42);
      local_40 = 1;
      goto LAB_0022b188;
    }
    std::__cxx11::string::operator=(local_30,"");
  }
  std::__cxx11::string::substr((ulong)local_68,local_10);
  iVar4 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
                             ,in_stack_fffffffffffffda8,0);
  std::__cxx11::string::~string(local_68);
  local_48 = iVar4;
  std::__cxx11::stringstream::stringstream(local_1f0);
  poVar8 = std::operator<<(local_1e0,local_30);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  _Var5 = std::setprecision(2);
  poVar8 = std::operator<<(poVar8,_Var5);
  std::ostream::operator<<(poVar8,(float)local_48 / 100.0);
  std::__cxx11::stringstream::str();
  local_40 = 1;
  std::__cxx11::stringstream::~stringstream(local_1f0);
LAB_0022b188:
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string Price(const std::string& ean5AddOn)
{
	if (ean5AddOn.size() != 5)
		return {};

	std::string currency;
	switch (ean5AddOn.front()) {
	case '0': [[fallthrough]];
	case '1': currency = "GBP £"; break; // UK
	case '3': currency = "AUD $"; break; // AUS
	case '4': currency = "NZD $"; break; // NZ
	case '5': currency = "USD $"; break; // US
	case '6': currency = "CAD $"; break; // CA
	case '9':
		// Reference: http://www.jollytech.com
		if (ean5AddOn == "90000") // No suggested retail price
			return {};
		if (ean5AddOn == "99991") // Complementary
			return "0.00";
		if (ean5AddOn == "99990")
			return "Used";

		// Otherwise... unknown currency?
		currency = "";
		break;
	default: currency = ""; break;
	}

	int rawAmount = std::stoi(ean5AddOn.substr(1));
	std::stringstream buf;
	buf << currency << std::fixed << std::setprecision(2) << (float(rawAmount) / 100);
	return buf.str();
}